

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
defyx::AssemblyGeneratorX86::generateC(AssemblyGeneratorX86 *this,SuperscalarProgram *prog)

{
  undefined1 *puVar1;
  char cVar2;
  
  std::__cxx11::stringbuf::str((string *)&this->field_0x18);
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"#include <stdint.h>",0x13);
  cVar2 = (char)puVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"#if defined(__SIZEOF_INT128__)",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\tstatic inline uint64_t mulh(uint64_t a, uint64_t b) {",0x36);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\treturn ((unsigned __int128)a * b) >> 64;",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t}",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\tstatic inline int64_t smulh(int64_t a, int64_t b) {",0x34);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\treturn ((__int128)a * b) >> 64;",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t}",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t#define HAVE_MULH",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t#define HAVE_SMULH",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"#endif",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"#if defined(_MSC_VER)",0x15)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t#define HAS_VALUE(X) X ## 0",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t#define EVAL_DEFINE(X) HAS_VALUE(X)",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t#include <intrin.h>",0x14)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t#include <stdlib.h>",0x14)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\tstatic __inline uint64_t rotr(uint64_t x , int c) {",0x34);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\treturn _rotr64(x, c);",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t}",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t#define HAVE_ROTR",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t#if EVAL_DEFINE(__MACHINEARM64_X64(1))",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\tstatic __inline uint64_t mulh(uint64_t a, uint64_t b) {",0x39);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\t\treturn __umulh(a, b);",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t\t}",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t\t#define HAVE_MULH",0x13)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t#endif",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t#if EVAL_DEFINE(__MACHINEX64(1))",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\tstatic __inline int64_t smulh(int64_t a, int64_t b) {",0x37);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t\t\tint64_t hi;",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\t\t_mul128(a, b, &hi);",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t\t\treturn hi;",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t\t}",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\t#define HAVE_SMULH",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t#endif",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"#endif",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"#ifndef HAVE_ROTR",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\tstatic inline uint64_t rotr(uint64_t a, int b) {",0x31);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t\treturn (a >> b) | (a << (64 - b));",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t}",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\t#define HAVE_ROTR",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"#endif",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,
             "#if !defined(HAVE_MULH) || !defined(HAVE_SMULH) || !defined(HAVE_ROTR)",0x46);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"\t#error \"Required functions are not defined\"",0x2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"#endif",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"void superScalar(uint64_t r[8]) {",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,
             "uint64_t r8 = r[0], r9 = r[1], r10 = r[2], r11 = r[3], r12 = r[4], r13 = r[5], r14 = r[6], r15 = r[7];"
             ,0x66);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (prog->size == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,
               "r[0] = r8; r[1] = r9; r[2] = r10; r[3] = r11; r[4] = r12; r[5] = r13; r[6] = r14; r[7] = r15;"
               ,0x5d);
    std::ios::widen((char)*(undefined8 *)(*(long *)puVar1 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"}",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)puVar1 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    return;
  }
  (*(code *)(&DAT_0011d348 + *(int *)(&DAT_0011d348 + (ulong)prog->programBuffer[0].opcode * 4)))();
  return;
}

Assistant:

void AssemblyGeneratorX86::generateC(SuperscalarProgram& prog) {
		asmCode.str(std::string()); //clear
		asmCode << "#include <stdint.h>" << std::endl;
		asmCode << "#if defined(__SIZEOF_INT128__)" << std::endl;
		asmCode << "	static inline uint64_t mulh(uint64_t a, uint64_t b) {" << std::endl;
		asmCode << "		return ((unsigned __int128)a * b) >> 64;" << std::endl;
		asmCode << "	}" << std::endl;
		asmCode << "	static inline int64_t smulh(int64_t a, int64_t b) {" << std::endl;
		asmCode << "		return ((__int128)a * b) >> 64;" << std::endl;
		asmCode << "	}" << std::endl;
		asmCode << "	#define HAVE_MULH" << std::endl;
		asmCode << "	#define HAVE_SMULH" << std::endl;
		asmCode << "#endif" << std::endl;
		asmCode << "#if defined(_MSC_VER)" << std::endl;
		asmCode << "	#define HAS_VALUE(X) X ## 0" << std::endl;
		asmCode << "	#define EVAL_DEFINE(X) HAS_VALUE(X)" << std::endl;
		asmCode << "	#include <intrin.h>" << std::endl;
		asmCode << "	#include <stdlib.h>" << std::endl;
		asmCode << "	static __inline uint64_t rotr(uint64_t x , int c) {" << std::endl;
		asmCode << "		return _rotr64(x, c);" << std::endl;
		asmCode << "	}" << std::endl;
		asmCode << "	#define HAVE_ROTR" << std::endl;
		asmCode << "	#if EVAL_DEFINE(__MACHINEARM64_X64(1))" << std::endl;
		asmCode << "		static __inline uint64_t mulh(uint64_t a, uint64_t b) {" << std::endl;
		asmCode << "			return __umulh(a, b);" << std::endl;
		asmCode << "		}" << std::endl;
		asmCode << "		#define HAVE_MULH" << std::endl;
		asmCode << "	#endif" << std::endl;
		asmCode << "	#if EVAL_DEFINE(__MACHINEX64(1))" << std::endl;
		asmCode << "		static __inline int64_t smulh(int64_t a, int64_t b) {" << std::endl;
		asmCode << "			int64_t hi;" << std::endl;
		asmCode << "			_mul128(a, b, &hi);" << std::endl;
		asmCode << "			return hi;" << std::endl;
		asmCode << "		}" << std::endl;
		asmCode << "		#define HAVE_SMULH" << std::endl;
		asmCode << "	#endif" << std::endl;
		asmCode << "#endif" << std::endl;
		asmCode << "#ifndef HAVE_ROTR" << std::endl;
		asmCode << "	static inline uint64_t rotr(uint64_t a, int b) {" << std::endl;
		asmCode << "		return (a >> b) | (a << (64 - b));" << std::endl;
		asmCode << "	}" << std::endl;
		asmCode << "	#define HAVE_ROTR" << std::endl;
		asmCode << "#endif" << std::endl;
		asmCode << "#if !defined(HAVE_MULH) || !defined(HAVE_SMULH) || !defined(HAVE_ROTR)" << std::endl;
		asmCode << "	#error \"Required functions are not defined\"" << std::endl;
		asmCode << "#endif" << std::endl;
		asmCode << "void superScalar(uint64_t r[8]) {" << std::endl;
		asmCode << "uint64_t r8 = r[0], r9 = r[1], r10 = r[2], r11 = r[3], r12 = r[4], r13 = r[5], r14 = r[6], r15 = r[7];" << std::endl;
		for (unsigned i = 0; i < prog.getSize(); ++i) {
			Instruction& instr = prog(i);
			switch ((SuperscalarInstructionType)instr.opcode)
			{
			case SuperscalarInstructionType::ISUB_R:
				asmCode << regR[instr.dst] << " -= " << regR[instr.src] << ";" << std::endl;
				break;
			case SuperscalarInstructionType::IXOR_R:
				asmCode << regR[instr.dst] << " ^= " << regR[instr.src] << ";" << std::endl;
				break;
			case SuperscalarInstructionType::IADD_RS:
				asmCode << regR[instr.dst] << " += " << regR[instr.src] << "*" << (1 << (instr.getModShift())) << ";" << std::endl;
				break;
			case SuperscalarInstructionType::IMUL_R:
				asmCode << regR[instr.dst] << " *= " << regR[instr.src] << ";" << std::endl;
				break;
			case SuperscalarInstructionType::IROR_C:
				asmCode << regR[instr.dst] << " = rotr(" << regR[instr.dst] << ", " << instr.getImm32() << ");" << std::endl;
				break;
			case SuperscalarInstructionType::IADD_C7:
			case SuperscalarInstructionType::IADD_C8:
			case SuperscalarInstructionType::IADD_C9:
				asmCode << regR[instr.dst] << " += " << (int32_t)instr.getImm32() << ";" << std::endl;
				break;
			case SuperscalarInstructionType::IXOR_C7:
			case SuperscalarInstructionType::IXOR_C8:
			case SuperscalarInstructionType::IXOR_C9:
				asmCode << regR[instr.dst] << " ^= " << (int32_t)instr.getImm32() << ";" << std::endl;
				break;
			case SuperscalarInstructionType::IMULH_R:
				asmCode << regR[instr.dst] << " = mulh(" << regR[instr.dst] << ", " << regR[instr.src] << ");" << std::endl;
				break;
			case SuperscalarInstructionType::ISMULH_R:
				asmCode << regR[instr.dst] << " = smulh(" << regR[instr.dst] << ", " << regR[instr.src] << ");" << std::endl;
				break;
			case SuperscalarInstructionType::IMUL_RCP:
				asmCode << regR[instr.dst] << " *= " << (int64_t)defyx_reciprocal(instr.getImm32()) << ";" << std::endl;
				break;
			default:
				UNREACHABLE;
			}
		}
		asmCode << "r[0] = r8; r[1] = r9; r[2] = r10; r[3] = r11; r[4] = r12; r[5] = r13; r[6] = r14; r[7] = r15;" << std::endl;
		asmCode << "}" << std::endl;
	}